

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

ByteData *
cfd::core::ConvertBitcoinTxFromWally
          (ByteData *__return_storage_ptr__,wally_tx *tx,bool force_exclude_witness)

{
  wally_tx_witness_stack *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx_witness_item *pwVar3;
  bool bVar4;
  ulong uVar5;
  CfdException *pCVar6;
  size_t *psVar7;
  ulong uVar8;
  uint32_t initial_size;
  long lVar9;
  size_t value;
  uint uVar10;
  ulong uVar11;
  wally_tx_input *pwVar12;
  byte bVar13;
  int ret;
  Serializer builder;
  size_t size;
  size_t tx_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t witness_count;
  int local_94;
  Serializer local_90;
  size_t local_68;
  size_t local_60;
  uchar *local_58;
  long local_50;
  ByteData *local_40;
  size_t local_38;
  
  local_38 = 0;
  local_94 = wally_tx_get_witness_count(tx,&local_38);
  if (local_94 != 0) {
    local_90._vptr_Serializer = (_func_int **)0x5d659b;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3ca;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::log<int&>((CfdSourceLocation *)&local_90,kCfdLogLevelWarning,
                      "wally_tx_get_witness_count NG[{}]",&local_94);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._vptr_Serializer =
         (_func_int **)
         &local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"psbt witness count get error.","");
    CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_90);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar13 = ~force_exclude_witness & local_38 != 0;
  local_68 = 0;
  local_94 = wally_tx_get_length(tx,(uint)bVar13,&local_68);
  if (local_94 != 0) {
    local_90._vptr_Serializer = (_func_int **)0x5d659b;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d4;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::log<int&>((CfdSourceLocation *)&local_90,kCfdLogLevelWarning,
                      "wally_tx_get_length NG[{}]",&local_94);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._vptr_Serializer =
         (_func_int **)
         &local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"psbt tx size get error.","");
    CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_90);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,local_68,
             (allocator_type *)&local_90);
  local_60 = 0;
  if (local_68 < 0x14) {
    local_94 = -2;
  }
  else {
    local_94 = wally_tx_to_bytes(tx,(uint)bVar13,local_58,local_50 - (long)local_58,&local_60);
    if (local_94 != -2) {
      if (local_94 != 0) {
        local_90._vptr_Serializer = (_func_int **)0x5d659b;
        local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x437;
        local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
        logger::log<int&>((CfdSourceLocation *)&local_90,kCfdLogLevelWarning,
                          "wally_tx_to_bytes NG[{}].",&local_94);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_90._vptr_Serializer =
             (_func_int **)
             &local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"psbt tx hex convert error.","");
        CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_90);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::ByteData(__return_storage_ptr__,local_58,(uint32_t)local_60);
      goto LAB_00328616;
    }
  }
  if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
    local_90._vptr_Serializer = (_func_int **)0x5d659b;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x433;
    local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::log<int&>((CfdSourceLocation *)&local_90,kCfdLogLevelWarning,"wally_tx_to_bytes NG[{}]."
                      ,&local_94);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_90._vptr_Serializer =
         (_func_int **)
         &local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"tx hex convert error.","");
    CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_90);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_90._vptr_Serializer = (_func_int **)0x5d659b;
  local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3eb;
  local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)&local_90,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
             &local_68);
  uVar5 = tx->num_inputs;
  uVar8 = tx->num_outputs;
  lVar9 = uVar8 * 0x70 + uVar5 * 0xd0 + 0x38;
  if (uVar5 != 0) {
    psVar7 = &tx->inputs->script_len;
    uVar10 = 1;
    do {
      lVar9 = lVar9 + *psVar7 + 10;
      uVar11 = (ulong)uVar10;
      psVar7 = psVar7 + 0x1a;
      uVar10 = uVar10 + 1;
    } while (uVar11 < uVar5);
  }
  if (uVar8 != 0) {
    psVar7 = &tx->outputs->script_len;
    uVar10 = 1;
    do {
      lVar9 = lVar9 + *psVar7 + 10;
      uVar11 = (ulong)uVar10;
      psVar7 = psVar7 + 0xe;
      uVar10 = uVar10 + 1;
    } while (uVar11 < uVar8);
  }
  initial_size = (uint32_t)lVar9;
  if (uVar5 != 0 && bVar13 == 1) {
    uVar8 = 0;
    do {
      pwVar1 = tx->inputs[uVar8].witness;
      if ((pwVar1 != (wally_tx_witness_stack *)0x0) && (pwVar1->num_items != 0)) {
        psVar7 = &pwVar1->items->witness_len;
        uVar10 = 1;
        do {
          lVar9 = lVar9 + *psVar7 + 10;
          uVar11 = (ulong)uVar10;
          psVar7 = psVar7 + 2;
          uVar10 = uVar10 + 1;
        } while (uVar11 < pwVar1->num_items);
      }
      lVar9 = lVar9 + 10;
      initial_size = (uint32_t)lVar9;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < uVar5);
  }
  Serializer::Serializer(&local_90,initial_size);
  Serializer::AddDirectNumber(&local_90,tx->version);
  value = tx->num_inputs;
  if (bVar13 != 0) {
    if (value == 0) {
      value = 0;
    }
    else {
      Serializer::AddDirectByte(&local_90,'\0');
      Serializer::AddDirectByte(&local_90,'\x01');
      value = tx->num_inputs;
    }
  }
  Serializer::AddVariableInt(&local_90,value);
  if (tx->num_inputs != 0) {
    uVar5 = 0;
    uVar8 = 1;
    do {
      pwVar12 = tx->inputs + uVar5;
      Serializer::AddDirectBytes(&local_90,pwVar12->txhash,0x20);
      Serializer::AddDirectNumber(&local_90,pwVar12->index);
      Serializer::AddVariableBuffer(&local_90,pwVar12->script,(uint32_t)pwVar12->script_len);
      Serializer::AddDirectNumber(&local_90,pwVar12->sequence);
      bVar4 = uVar8 < tx->num_inputs;
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  Serializer::AddVariableInt(&local_90,tx->num_outputs);
  local_40 = __return_storage_ptr__;
  if (tx->num_outputs != 0) {
    uVar5 = 0;
    uVar8 = 1;
    do {
      pwVar2 = tx->outputs;
      Serializer::AddDirectNumber(&local_90,pwVar2[uVar5].satoshi);
      Serializer::AddVariableBuffer
                (&local_90,pwVar2[uVar5].script,(uint32_t)pwVar2[uVar5].script_len);
      bVar4 = uVar8 < tx->num_outputs;
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  if ((bVar13 != 0) && (tx->num_inputs != 0)) {
    uVar5 = 0;
    do {
      pwVar12 = tx->inputs;
      pwVar1 = pwVar12[uVar5].witness;
      uVar10 = 0;
      if (pwVar1 != (wally_tx_witness_stack *)0x0) {
        uVar10 = (uint)pwVar1->num_items;
      }
      uVar8 = (ulong)uVar10;
      Serializer::AddVariableInt(&local_90,uVar8);
      if (uVar8 != 0) {
        lVar9 = 0;
        do {
          pwVar3 = (pwVar12[uVar5].witness)->items;
          Serializer::AddVariableBuffer
                    (&local_90,*(uint8_t **)((long)&pwVar3->witness + lVar9),
                     *(uint32_t *)((long)&pwVar3->witness_len + lVar9));
          lVar9 = lVar9 + 0x10;
        } while (uVar8 << 4 != lVar9);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < tx->num_inputs);
  }
  Serializer::AddDirectNumber(&local_90,tx->locktime);
  __return_storage_ptr__ = local_40;
  Serializer::Output(local_40,&local_90);
  local_90._vptr_Serializer = (_func_int **)&PTR__Serializer_0072e608;
  if ((void *)CONCAT44(local_90.buffer_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_90.buffer_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_90.buffer_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_90.buffer_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
LAB_00328616:
  if (local_58 != (uchar *)0x0) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ConvertBitcoinTxFromWally(
    const struct wally_tx *tx, bool force_exclude_witness) {
  int ret;
  size_t witness_count = 0;
  ret = wally_tx_get_witness_count(tx, &witness_count);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_witness_count NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt witness count get error.");
  }

  uint32_t flags = (witness_count != 0) ? WALLY_TX_FLAG_USE_WITNESS : 0;
  if (force_exclude_witness) flags = 0;

  size_t size = 0;
  ret = wally_tx_get_length(tx, flags, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt tx size get error.");
  }

  try {
    std::vector<uint8_t> buf(size);
    size_t tx_size = 0;

    if (size < kTransactionMinimumHexSize) {
      ret = WALLY_EINVAL;
    } else {
      ret = wally_tx_to_bytes(tx, flags, buf.data(), buf.size(), &tx_size);
    }

    if (ret == WALLY_OK) {
      return ByteData(buf.data(), static_cast<uint32_t>(tx_size));
    } else if (ret == WALLY_EINVAL) {
      /* TODO: About conversion to the object.
      * In libwally, txin / txout does not allow empty data.
      * Therefore, if txin / txout is empty, object to byte is an error.
      * Therefore, it performs its own processing under certain circumstances.
      */
      if ((tx->num_inputs == 0) || (tx->num_outputs == 0)) {
        info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
        // Necessary size calculation because wally_tx_get_length may be
        // an invalid value (reserved more)
        size_t need_size = sizeof(struct wally_tx);
        need_size += tx->num_inputs * sizeof(struct wally_tx_input);
        need_size += tx->num_outputs * sizeof(struct wally_tx_output);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          need_size += input->script_len + 10;
        }
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          need_size += output->script_len + 10;
        }
        if (flags != 0) {
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              need_size += stack->witness_len + 10;
            }
            need_size += 10;
          }
        }

        Serializer builder(static_cast<uint32_t>(need_size));
        builder.AddDirectNumber(tx->version);
        if ((flags != 0) && (tx->num_inputs != 0)) {  // witness
          builder.AddDirectByte(0);                   // marker is 0
          builder.AddDirectByte(1);                   // flag is 1(witness)
        }

        builder.AddVariableInt(tx->num_inputs);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          builder.AddDirectBytes(input->txhash, sizeof(input->txhash));
          builder.AddDirectNumber(input->index);
          builder.AddVariableBuffer(
              input->script, static_cast<uint32_t>(input->script_len));
          builder.AddDirectNumber(input->sequence);
        }

        builder.AddVariableInt(tx->num_outputs);
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          builder.AddDirectNumber(output->satoshi);
          builder.AddVariableBuffer(
              output->script, static_cast<uint32_t>(output->script_len));
        }

        if (flags != 0) {  // witness
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            uint32_t num_items =
                input->witness
                    ? static_cast<uint32_t>(input->witness->num_items)
                    : 0;
            builder.AddVariableInt(num_items);
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              builder.AddVariableBuffer(
                  stack->witness, static_cast<uint32_t>(stack->witness_len));
            }
          }
        }

        builder.AddDirectNumber(tx->locktime);
        return builder.Output();
      } else {
        warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
      }
    } else {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "psbt tx hex convert error.");
    }
  } catch (const CfdError &except) {
    throw except;
  } catch (const std::exception &except) {
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}